

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix7.cpp
# Opt level: O3

void radix_sort7_int64(int64_t *array,size_t count)

{
  ulong *puVar1;
  int64_t *piVar2;
  size_t sVar3;
  undefined1 *puVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int64_t *piVar8;
  int64_t *piVar9;
  int64_t *piVar10;
  ulong uVar11;
  size_t *__s;
  bool bVar12;
  int64_t *queue_ptrs [256];
  freq_array_type freqs;
  long alStack_4838 [256];
  size_t local_4038;
  undefined1 local_4030 [16384];
  
  piVar2 = (int64_t *)operator_new__(-(ulong)(count >> 0x3d != 0) | count * 8);
  __s = &local_4038;
  memset(__s,0,0x4000);
  if (count != 0) {
    sVar3 = 0;
    do {
      uVar5 = array[sVar3];
      lVar7 = 0;
      do {
        *(long *)(local_4030 + lVar7 + (uVar5 & 0xff) * 8 + -8) =
             *(long *)(local_4030 + lVar7 + (uVar5 & 0xff) * 8 + -8) + 1;
        uVar5 = uVar5 >> 8;
        lVar7 = lVar7 + 0x800;
      } while (lVar7 != 0x4000);
      sVar3 = sVar3 + 1;
    } while (sVar3 != count);
  }
  puVar4 = local_4030;
  lVar7 = 0;
  piVar8 = array;
  piVar10 = piVar2;
  do {
    sVar3 = *(size_t *)(local_4030 + lVar7 * 0x800 + -8);
    piVar9 = piVar8;
    if (sVar3 == 0) {
      uVar5 = 0xffffffffffffffff;
      do {
        if (uVar5 == 0xfe) goto LAB_00117dbf;
        sVar3 = *(size_t *)(puVar4 + uVar5 * 8 + 8);
        uVar5 = uVar5 + 1;
      } while (sVar3 == 0);
      bVar12 = 0xfe < uVar5;
    }
    else {
      bVar12 = false;
    }
    if ((!bVar12) && (sVar3 != count)) {
      lVar6 = 0;
      piVar9 = piVar10;
      do {
        alStack_4838[lVar6] = (long)piVar9;
        piVar9 = piVar9 + __s[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x100);
      piVar9 = piVar10;
      piVar10 = piVar8;
      if (count != 0) {
        sVar3 = 0;
        do {
          uVar5 = piVar8[sVar3];
          uVar11 = uVar5 >> ((char)lVar7 * '\b' & 0x3fU) & 0xff;
          puVar1 = (ulong *)alStack_4838[uVar11];
          alStack_4838[uVar11] = (long)(puVar1 + 1);
          *puVar1 = uVar5;
          sVar3 = sVar3 + 1;
        } while (count != sVar3);
      }
    }
LAB_00117dbf:
    lVar7 = lVar7 + 1;
    puVar4 = puVar4 + 0x800;
    __s = __s + 0x100;
    piVar8 = piVar9;
    if (lVar7 == 8) {
      if ((count != 0) && (piVar9 != array)) {
        memmove(array,piVar9,count * 8);
      }
      operator_delete__(piVar2);
      return;
    }
  } while( true );
}

Assistant:

void radix_sort7_int64(int64_t *array, size_t count) {
  std::unique_ptr<int64_t[]> queue_area(new int64_t[count]);
  // huge_unique_ptr<uint64_t[]> queue_area = make_huge_array<uint64_t>(count,
  // false);

  freq_array_type freqs = {};
  count_frequency(array, count, freqs);

  int64_t *from = array, *to = queue_area.get();

  for (size_t pass = 0; pass < RADIX_LEVELS; pass++) {

    if (is_trivial(freqs[pass], count)) {
      // this pass would do nothing, just skip it
      continue;
    }

    int shift = pass * RADIX_BITS;

    // array of pointers to the current position in each queue, which we set up
    // based on the known final sizes of each queue (i.e., "tighly packed")
    int64_t *queue_ptrs[RADIX_SIZE], *next = to;
    for (size_t i = 0; i < RADIX_SIZE; i++) {
      queue_ptrs[i] = next;
      next += freqs[pass][i];
    }

    // copy each element into the appropriate queue based on the current
    // RADIX_BITS sized "digit" within it
    for (size_t i = 0; i < count; i++) {
      size_t value = from[i];
      size_t index = (value >> shift) & RADIX_MASK;
      *queue_ptrs[index]++ = value;
      __builtin_prefetch(queue_ptrs[index] + 1);
    }

    // swap from and to areas
    std::swap(from, to);
  }

  // because of the last swap, the "from" area has the sorted payload: if it's
  // not the original array "a", do a final copy
  if (from != array) {
    std::copy(from, from + count, array);
  }
}